

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::BasicCopyTexSubImageCubeCase::createTexture
          (BasicCopyTexSubImageCubeCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  byte bVar3;
  int i;
  int iVar4;
  uint uVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  undefined4 extraout_var;
  Context *pCVar9;
  long lVar10;
  NotSupportedError *this_01;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ChannelOrder CVar15;
  bool bVar16;
  int face;
  long lVar17;
  uint uVar18;
  int ndx;
  float fVar19;
  uint local_260;
  deUint32 tex;
  ulong local_240;
  ulong local_238;
  deUint32 local_22c;
  Vec4 colorB;
  Vec4 colorA;
  TextureFormat fmt;
  Random rnd;
  PixelBufferAccess local_1e8;
  TextureLevel data;
  float afStack_198 [4];
  GradientShader shader;
  
  iVar4 = (*((this->super_TextureSpecCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[4])();
  lVar17 = CONCAT44(extraout_var,iVar4);
  bVar16 = false;
  if ((0 < *(int *)(lVar17 + 8)) && (0 < *(int *)(lVar17 + 0xc))) {
    bVar16 = 0 < *(int *)(lVar17 + 0x10);
  }
  iVar4 = *(int *)(lVar17 + 0x14);
  fmt = (this->super_TextureSpecCase).m_texFormat;
  CVar15 = fmt.order;
  bVar3 = (byte)fmt.order;
  local_260 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar11 = (this->super_TextureSpecCase).m_width;
    uVar5 = 0x20;
    uVar13 = 0x20;
    if (uVar11 != 0) {
      uVar13 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar13 == 0; uVar13 = uVar13 - 1) {
        }
      }
      uVar13 = uVar13 ^ 0x1f;
    }
    uVar11 = (this->super_TextureSpecCase).m_height;
    if (uVar11 != 0) {
      uVar5 = 0x1f;
      if (uVar11 != 0) {
        for (; uVar11 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = uVar5 ^ 0x1f;
    }
    iVar14 = 0x1f - uVar5;
    if ((int)(0x1f - uVar5) < (int)(0x1f - uVar13)) {
      iVar14 = 0x1f - uVar13;
    }
    local_260 = iVar14 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar6 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar6);
  GradientShader::GradientShader(&shader);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar6 = (*pCVar9->_vptr_Context[0x75])(pCVar9,&shader);
  if ((CVar15 == A || bVar16) &&
     ((RGBA < CVar15 || (0xedU >> (bVar3 & 0x1f) & 1) != 0) || 0 < iVar4)) {
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
    local_22c = dVar6;
    if (0 < (int)local_260) {
      uVar12 = 0;
      do {
        iVar4 = (this->super_TextureSpecCase).m_width >> ((byte)uVar12 & 0x1f);
        if (iVar4 < 2) {
          iVar4 = 1;
        }
        iVar14 = (this->super_TextureSpecCase).m_height >> ((byte)uVar12 & 0x1f);
        if (iVar14 < 2) {
          iVar14 = 1;
        }
        local_240 = CONCAT44(local_240._4_4_,iVar4);
        local_238 = uVar12;
        tcu::TextureLevel::setSize(&data,iVar4,iVar14,1);
        lVar17 = 0;
        do {
          local_1e8.super_ConstPixelBufferAccess.m_format.order = R;
          local_1e8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
          local_1e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
          local_1e8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
          lVar10 = 0;
          do {
            colorB.m_data[lVar10] = 1.0;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          colorA.m_data[0] = 0.0;
          colorA.m_data[1] = 0.0;
          colorA.m_data[2] = 0.0;
          colorA.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            fVar1 = (float)local_1e8.super_ConstPixelBufferAccess.m_size.m_data[lVar10 + -2];
            fVar2 = colorB.m_data[lVar10];
            fVar19 = deRandom_getFloat(&rnd.m_rnd);
            colorA.m_data[lVar10] = (fVar2 - fVar1) * fVar19 + fVar1;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          local_1e8.super_ConstPixelBufferAccess.m_format.order = R;
          local_1e8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
          local_1e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
          local_1e8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
          lVar10 = 0;
          do {
            afStack_198[lVar10] = 1.0;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          colorB.m_data[0] = 0.0;
          colorB.m_data[1] = 0.0;
          colorB.m_data[2] = 0.0;
          colorB.m_data[3] = 0.0;
          lVar10 = 0;
          do {
            fVar1 = (float)local_1e8.super_ConstPixelBufferAccess.m_size.m_data[lVar10 + -2];
            fVar2 = afStack_198[lVar10];
            fVar19 = deRandom_getFloat(&rnd.m_rnd);
            colorB.m_data[lVar10] = (fVar2 - fVar1) * fVar19 + fVar1;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          dVar6 = deRandom_getUint32(&rnd.m_rnd);
          tcu::TextureLevel::getAccess(&local_1e8,&data);
          tcu::fillWithGrid(&local_1e8,dVar6 % 0xf + 2,&colorA,&colorB);
          dVar6 = (&s_cubeMapFaces)[lVar17];
          dVar7 = this->m_format;
          dVar8 = this->m_dataType;
          tcu::TextureLevel::getAccess(&local_1e8,&data);
          sglr::ContextWrapper::glTexImage2D
                    (this_00,dVar6,(int)local_238,dVar7,(int)local_240,iVar14,0,dVar7,dVar8,
                     local_1e8.super_ConstPixelBufferAccess.m_data);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 6);
        uVar11 = (int)local_238 + 1;
        uVar12 = (ulong)uVar11;
      } while (uVar11 != local_260);
    }
    pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_1e8.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
    local_1e8.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
    local_1e8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ =
         local_1e8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ & 0xffffffff00000000;
    colorA.m_data._0_8_ = &DAT_3f8000003f800000;
    colorA.m_data._8_8_ = colorA.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(pCVar9,local_22c,(Vec3 *)&local_1e8,(Vec3 *)&colorA);
    if (0 < (int)local_260) {
      uVar12 = 0;
      do {
        uVar11 = (this->super_TextureSpecCase).m_width >> ((byte)uVar12 & 0x1f);
        if ((int)uVar11 < 2) {
          uVar11 = 1;
        }
        uVar13 = (this->super_TextureSpecCase).m_height >> ((byte)uVar12 & 0x1f);
        if ((int)uVar13 < 2) {
          uVar13 = 1;
        }
        lVar17 = 0;
        local_240 = uVar12;
        do {
          dVar6 = deRandom_getUint32(&rnd.m_rnd);
          uVar5 = dVar6 % uVar11;
          dVar6 = deRandom_getUint32(&rnd.m_rnd);
          uVar18 = dVar6 % uVar13;
          dVar6 = deRandom_getUint32(&rnd.m_rnd);
          dVar7 = deRandom_getUint32(&rnd.m_rnd);
          local_238 = CONCAT44(local_238._4_4_,dVar7 % (uVar13 - uVar18));
          iVar4 = sglr::ContextWrapper::getWidth(this_00);
          dVar7 = deRandom_getUint32(&rnd.m_rnd);
          iVar14 = sglr::ContextWrapper::getHeight(this_00);
          dVar8 = deRandom_getUint32(&rnd.m_rnd);
          sglr::ContextWrapper::glCopyTexSubImage2D
                    (this_00,*(deUint32 *)((long)&s_cubeMapFaces + lVar17),(int)local_240,
                     dVar6 % (uVar11 - uVar5),(int)local_238,dVar7 % (iVar4 - uVar5),
                     dVar8 % (iVar14 - uVar18),uVar5 + 1,uVar18 + 1);
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x18);
        uVar11 = (int)local_240 + 1;
        uVar12 = (ulong)uVar11;
      } while (uVar11 != local_260);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    tcu::TextureLevel::~TextureLevel(&data);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported","",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureSpecificationTests.cpp"
             ,0x5c0);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= m_texFormat;
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		int							numLevels		= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader;
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);
				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Fill render target with gradient.
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelW);
				int		h			= rnd.getInt(1, levelH);
				int		xo			= rnd.getInt(0, levelW-w);
				int		yo			= rnd.getInt(0, levelH-h);

				int		x			= rnd.getInt(0, getWidth() - w);
				int		y			= rnd.getInt(0, getHeight() - h);

				glCopyTexSubImage2D(s_cubeMapFaces[face], ndx, xo, yo, x, y, w, h);
			}
		}
	}